

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.c
# Opt level: O0

uint gt_cntfrq_period_ns_arm(ARMCPU *cpu)

{
  undefined1 auVar1 [16];
  uint local_18;
  ARMCPU *cpu_local;
  
  if (cpu->gt_cntfrq_hz < 1000000000) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = cpu->gt_cntfrq_hz;
    local_18 = SUB164((ZEXT816(0) << 0x40 | ZEXT816(1000000000)) / auVar1,0);
  }
  else {
    local_18 = 1;
  }
  return local_18;
}

Assistant:

unsigned int gt_cntfrq_period_ns(ARMCPU *cpu)
{
    /*
     * The exact approach to calculating guest ticks is:
     *
     *     muldiv64(qemu_clock_get_ns(QEMU_CLOCK_VIRTUAL), cpu->gt_cntfrq_hz,
     *              NANOSECONDS_PER_SECOND);
     *
     * We don't do that. Rather we intentionally use integer division
     * truncation below and in the caller for the conversion of host monotonic
     * time to guest ticks to provide the exact inverse for the semantics of
     * the QEMUTimer scale factor. QEMUTimer's scale facter is an integer, so
     * it loses precision when representing frequencies where
     * `(NANOSECONDS_PER_SECOND % cpu->gt_cntfrq) > 0` holds. Failing to
     * provide an exact inverse leads to scheduling timers with negative
     * periods, which in turn leads to sticky behaviour in the guest.
     *
     * Finally, CNTFRQ is effectively capped at 1GHz to ensure our scale factor
     * cannot become zero.
     */
    return NANOSECONDS_PER_SECOND > cpu->gt_cntfrq_hz ?
      NANOSECONDS_PER_SECOND / cpu->gt_cntfrq_hz : 1;
}